

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O3

int64_t duckdb::DatePart::NanosecondsOperator::Operation<duckdb::timestamp_ns_t,long>
                  (timestamp_ns_t input)

{
  ConversionException *this;
  int32_t nanos;
  date_t date;
  dtime_t time;
  int local_48;
  date_t local_44;
  dtime_t local_40 [2];
  undefined1 local_30 [16];
  
  if ((input.super_timestamp_t.value != 0x7fffffffffffffff) &&
     (input.super_timestamp_t.value != -0x7fffffffffffffff)) {
    duckdb::Timestamp::Convert(input,&local_44,local_40,&local_48);
    return (long)local_48 + (local_40[0].micros % 60000000) * 1000;
  }
  this = (ConversionException *)__cxa_allocate_exception(0x10);
  local_40[0].micros = (int64_t)local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"Can\'t get nanoseconds of infinite TIMESTAMP","");
  duckdb::ConversionException::ConversionException(this,(string *)local_40);
  __cxa_throw(this,&ConversionException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int64_t DatePart::NanosecondsOperator::Operation(timestamp_ns_t input) {
	if (!Timestamp::IsFinite(input)) {
		throw ConversionException("Can't get nanoseconds of infinite TIMESTAMP");
	}
	date_t date;
	dtime_t time;
	int32_t nanos;
	Timestamp::Convert(input, date, time, nanos);
	// remove everything but the second & nanosecond part
	return (time.micros % Interval::MICROS_PER_MINUTE) * Interval::NANOS_PER_MICRO + nanos;
}